

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

OPAtomIndexFooter * __thiscall
ASDCP::MXF::OPAtomIndexFooter::InitFromBuffer(OPAtomIndexFooter *this,byte_t *p,ui32_t l)

{
  int iVar1;
  InterchangeObject *ThePacket;
  ILogSink *pIVar2;
  uint in_ECX;
  undefined4 in_register_00000014;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined **local_98;
  undefined1 local_90;
  undefined8 local_8f;
  undefined8 uStack_87;
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000014,l);
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&Kumu::RESULT_OK);
  puVar3 = (undefined8 *)((ulong)in_ECX + (long)puVar4);
  while ((iVar1 = *(int *)&(this->super_Partition).super_KLVFilePacket.super_KLVPacket.
                           _vptr_KLVPacket, -1 < iVar1 && (puVar4 < puVar3))) {
    local_90 = 1;
    local_8f = *puVar4;
    uStack_87 = puVar4[1];
    local_98 = &PTR__IArchive_002112c8;
    ThePacket = CreateObject(*(Dictionary **)(p + 0x78),(UL *)&local_98);
    if (ThePacket == (InterchangeObject *)0x0) {
      __assert_fail("object",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                    ,0x481,
                    "virtual ASDCP::Result_t ASDCP::MXF::OPAtomIndexFooter::InitFromBuffer(const byte_t *, ui32_t)"
                   );
    }
    ThePacket->m_Lookup = *(IPrimerLookup **)(p + 0x180);
    (*(ThePacket->super_KLVPacket)._vptr_KLVPacket[5])
              ((Result_t *)&local_98,ThePacket,puVar4,(ulong)(uint)((int)puVar3 - (int)puVar4));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_98);
    Kumu::Result_t::~Result_t((Result_t *)&local_98);
    puVar4 = (undefined8 *)
             ((long)puVar4 +
             (ulong)(ThePacket->super_KLVPacket).m_KLLength +
             (ThePacket->super_KLVPacket).m_ValueLength);
    if (*(int *)&(this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket < 0) {
      pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar2,"Error initializing OPAtom footer packet.\n");
      (*(ThePacket->super_KLVPacket)._vptr_KLVPacket[1])(ThePacket);
    }
    else {
      Partition::PacketList::AddPacket(*(PacketList **)(p + 0x70),ThePacket);
    }
  }
  if (iVar1 < 0) {
    pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar2,"Failed to initialize OPAtomIndexFooter.\n");
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OPAtomIndexFooter::InitFromBuffer(const byte_t* p, ui32_t l)
{
  Result_t result = RESULT_OK;
  const byte_t* end_p = p + l;
  
  while ( ASDCP_SUCCESS(result) && p < end_p )
    {
      // parse the packets and index them by uid, discard KLVFill items
      InterchangeObject* object = CreateObject(m_Dict, p);
      assert(object);

      object->m_Lookup = m_Lookup;
      result = object->InitFromBuffer(p, end_p - p);
      p += object->PacketLength();

      if ( ASDCP_SUCCESS(result) )
	{
	  m_PacketList->AddPacket(object); // takes ownership
	}
      else
	{
	  DefaultLogSink().Error("Error initializing OPAtom footer packet.\n");
	  delete object;
	}
    }

  if ( ASDCP_FAILURE(result) )
    {
      DefaultLogSink().Error("Failed to initialize OPAtomIndexFooter.\n");
    }

  return result;
}